

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_generation_test.cpp
# Opt level: O1

void genScript(string *material_name,string *image_name,string *scripts_dir)

{
  ostream *poVar1;
  stringstream local_568 [8];
  stringstream script_str;
  ostream local_558 [112];
  ios_base aiStack_4e8 [264];
  stringstream local_3e0 [8];
  stringstream file_path;
  ostream local_3d0 [112];
  ios_base aiStack_360 [264];
  long local_258;
  ofstream ofs;
  ios_base local_160 [264];
  string *local_58;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  local_58 = scripts_dir;
  std::__cxx11::stringstream::stringstream(local_568);
  std::__cxx11::stringstream::stringstream(local_3e0);
  std::__ostream_insert<char,std::char_traits<char>>(local_558,"material ",9);
  std::__ostream_insert<char,std::char_traits<char>>(local_558,"Plugin/",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_558,(material_name->_M_dataplus)._M_p,material_name->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  technique",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  {",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    pass",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    {",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"      texture_unit",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"      {",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"        texture ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Plugin/",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(image_name->_M_dataplus)._M_p,image_name->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"        filtering anistropic",0x1c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"        max_anisotropy 16",0x19);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"      }",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    }",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  }",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_3d0,(local_58->_M_dataplus)._M_p,local_58->_M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(material_name->_M_dataplus)._M_p,material_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".material",9);
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&local_258,(string *)&local_50,_S_out);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,local_50,local_48);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  std::ofstream::close();
  local_258 = _VTT;
  *(undefined8 *)((long)&local_258 + *(long *)(_VTT + -0x18)) = __M_replace;
  std::filebuf::~filebuf((filebuf *)&ofs);
  std::ios_base::~ios_base(local_160);
  std::__cxx11::stringstream::~stringstream(local_3e0);
  std::ios_base::~ios_base(aiStack_360);
  std::__cxx11::stringstream::~stringstream(local_568);
  std::ios_base::~ios_base(aiStack_4e8);
  return;
}

Assistant:

void genScript(
    const std::string material_name,
    const std::string image_name,
    const std::string & scripts_dir){

    std::stringstream script_str;
    std::stringstream file_path;

    if (GENERATE_SCRIPT){

        script_str
        << "material " << MATERIAL_PREFIX << material_name
        << std::endl << "{"
        << std::endl << "  technique"
        << std::endl << "  {"
        << std::endl << "    pass"
        << std::endl << "    {"
        << std::endl << "      texture_unit"
        << std::endl << "      {"
        << std::endl << "        texture " << TEXTURE_PREFIX << image_name
        << std::endl << "        filtering anistropic"
        << std::endl << "        max_anisotropy 16"
        << std::endl << "      }"
        << std::endl << "    }"
        << std::endl << "  }"
        << std::endl << "}" << std::endl;

        file_path << scripts_dir << material_name << MATERIAL_EXT;

        /* Write to file */
        std::ofstream ofs(file_path.str());
        ofs << script_str.str();
        ofs.close();
    }
}